

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

rotation_t *
opengv::relative_pose::eigensolver
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices,
          eigensolverOutput_t *output,bool useWeights)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  int iVar11;
  size_t i;
  ActualDstType actualDst;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar35 [16];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  bearingVector_t f1_1;
  Matrix3d zxF;
  Matrix3d yyF;
  Matrix3d xxF;
  bearingVector_t f2;
  Matrix3d yzF;
  bearingVector_t f1;
  Matrix3d xyF;
  Matrix3d zzF;
  double local_338;
  ulong local_330;
  double local_308;
  double local_300;
  double local_2f8;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  Matrix3d local_278;
  Matrix3d local_228;
  Matrix3d local_1d8;
  double local_188 [4];
  Matrix3d local_168;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  ulong local_d8;
  undefined1 local_c8 [16];
  undefined1 auStack_b8 [16];
  undefined1 auStack_a8 [16];
  double dStack_98;
  double dStack_90;
  double local_88;
  undefined1 local_78 [16];
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 auStack_48 [16];
  double local_38;
  
  sVar1 = indices->_numberCorrespondences;
  dVar21 = 0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_38 = 0.0;
  local_88 = 0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_78 = ZEXT816(0);
  auStack_68 = ZEXT816(0);
  auStack_58 = ZEXT816(0);
  auStack_48 = ZEXT816(0);
  local_c8 = ZEXT816(0);
  auStack_b8 = ZEXT816(0);
  auStack_a8 = ZEXT816(0);
  dStack_98 = 0.0;
  dStack_90 = 0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  if (sVar1 != 0) {
    dVar31 = 0.0;
    lVar8 = 0;
    sVar10 = 0;
    do {
      if (indices->_useIndices == false) {
        iVar9 = (int)sVar10;
      }
      else {
        iVar9 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + (lVar8 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar9);
      auVar25 = in_ZMM23._0_16_;
      auVar20 = in_ZMM22._0_16_;
      auVar18 = in_ZMM21._0_16_;
      auVar19 = in_ZMM20._0_16_;
      auVar15 = in_ZMM19._0_16_;
      auVar14 = in_ZMM18._0_16_;
      auVar13 = in_ZMM17._0_16_;
      auVar17 = in_ZMM16._0_16_;
      dVar21 = dVar21 * dVar21;
      sVar10 = sVar10 + 1;
      lVar8 = lVar8 + 0x100000000;
      dVar31 = dVar31 + dVar21;
    } while (sVar1 != sVar10);
    local_338 = 0.0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar31;
    if (dVar31 < 0.0) {
      dVar21 = sqrt(dVar31);
    }
    else {
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
      dVar21 = auVar12._0_8_;
    }
    dVar31 = 0.0;
    dVar32 = 0.0;
    dVar33 = 0.0;
    dVar34 = 0.0;
    auVar12 = vxorpd_avx512vl(auVar17,auVar17);
    auVar13 = vxorpd_avx512vl(auVar13,auVar13);
    auVar14 = vxorpd_avx512vl(auVar14,auVar14);
    auVar15 = vxorpd_avx512vl(auVar15,auVar15);
    auVar16 = vxorpd_avx512vl(auVar19,auVar19);
    auVar17 = vxorpd_avx512vl(auVar18,auVar18);
    auVar18 = vxorpd_avx512vl(auVar20,auVar20);
    auVar19 = vxorpd_avx512vl(auVar25,auVar25);
    sVar10 = 0;
    do {
      iVar11 = (int)sVar10;
      vmovsd_avx512f(auVar15);
      iVar9 = iVar11;
      if (indices->_useIndices == true) {
        iVar9 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar11];
      }
      local_2e8 = auVar19;
      local_2d8 = auVar18;
      local_2c8 = auVar17;
      local_2b8 = auVar16;
      local_2a8 = auVar14;
      local_298 = auVar13;
      local_288 = auVar12;
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_308,adapter,(long)iVar9);
      iVar9 = iVar11;
      if (indices->_useIndices == true) {
        iVar9 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar11];
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(local_188,adapter,(long)iVar9);
      pdVar7 = &local_108;
      lVar8 = 0;
      do {
        dVar24 = local_188[lVar8];
        lVar8 = lVar8 + 1;
        pdVar7[-2] = local_188[0] * dVar24;
        pdVar7[-1] = local_188[1] * dVar24;
        *pdVar7 = dVar24 * local_188[2];
        pdVar7 = pdVar7 + 3;
      } while (lVar8 != 3);
      auVar17 = ZEXT816(0x3ff0000000000000);
      if (useWeights) {
        if (indices->_useIndices == true) {
          iVar11 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar11];
        }
        dVar24 = local_188[0];
        dVar26 = local_188[1];
        (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar11);
        auVar17._0_8_ = dVar24 / dVar21;
        auVar17._8_8_ = dVar26;
      }
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_330;
      sVar10 = sVar10 + 1;
      dVar2 = auVar17._0_8_ * local_308;
      dVar24 = dVar2 * local_308;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar24;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_d8;
      auVar13 = vmulsd_avx512f(auVar14,auVar38);
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = local_118 * dVar24 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dStack_110 * dVar24 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = dVar24 * local_108 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = dVar24 * dStack_100 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = dVar24 * local_f8 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = dVar24 * dStack_f0 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = dVar24 * local_e8 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = dVar24 * dStack_e0 +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = auVar13._0_8_ +
            local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
      dVar24 = auVar17._0_8_ * local_300;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_2f8;
      auVar17 = vmulsd_avx512f(auVar17,auVar36);
      dVar26 = dVar24 * local_300;
      dVar2 = dVar2 * local_300;
      dVar3 = local_308 * auVar17._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar2;
      auVar20 = vmulsd_avx512f(auVar38,auVar13);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar26;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_d8;
      auVar13 = vmulsd_avx512f(auVar39,auVar15);
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar26 * local_118 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dVar26 * dStack_110 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = dVar26 * local_108 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = dVar26 * dStack_100 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = dVar26 * local_f8 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = dVar26 * dStack_f0 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = dVar26 * local_e8 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = dVar26 * dStack_e0 +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
      auVar17 = vmulsd_avx512f(auVar36,auVar17);
      local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = auVar13._0_8_ +
            local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
      dVar26 = auVar17._0_8_;
      auVar17 = vmulsd_avx512f(auVar39,auVar17);
      auVar19._0_8_ = dVar26 * local_118;
      auVar19._8_8_ = dVar26 * dStack_110;
      auVar15 = vaddsd_avx512f(auVar17,auVar35);
      auVar19 = vaddpd_avx512vl(local_2e8,auVar19);
      auVar18._0_8_ = dVar26 * local_108;
      auVar18._8_8_ = dVar26 * dStack_100;
      auVar18 = vaddpd_avx512vl(local_2d8,auVar18);
      auVar29._0_8_ = dVar26 * local_f8;
      auVar29._8_8_ = dVar26 * dStack_f0;
      auVar16._0_8_ = dVar26 * local_e8;
      auVar16._8_8_ = dVar26 * dStack_e0;
      auVar16 = vaddpd_avx512vl(auVar16,local_2b8);
      auVar27._0_8_ = dVar2 * local_118;
      auVar27._8_8_ = dVar2 * dStack_110;
      auVar17 = vaddpd_avx512vl(local_2c8,auVar29);
      auVar30._0_8_ = dVar2 * local_108;
      auVar30._8_8_ = dVar2 * dStack_100;
      auVar14 = vaddpd_avx512vl(auVar27,local_2a8);
      auVar28._0_8_ = dVar2 * local_f8;
      auVar28._8_8_ = dVar2 * dStack_f0;
      auVar13 = vaddpd_avx512vl(auVar30,local_298);
      vmovsd_avx512f(auVar15);
      dVar33 = dVar2 * local_e8 + dVar33;
      dVar34 = dVar2 * dStack_e0 + dVar34;
      auVar12 = vaddpd_avx512vl(auVar28,local_288);
      local_338 = local_338 + auVar20._0_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar24;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_2f8;
      auVar20 = vmulsd_avx512f(auVar25,auVar37);
      dVar24 = auVar20._0_8_;
      auVar20 = vmulsd_avx512f(auVar39,auVar20);
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = local_118 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dStack_110 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
      dVar31 = dVar24 * local_118 + dVar31;
      dVar32 = dVar24 * dStack_110 + dVar32;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = dVar24 * local_108 +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = dVar24 * dStack_100 +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = local_108 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = dStack_100 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = dVar24 * local_f8 +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = dVar24 * dStack_f0 +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = local_f8 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = dStack_f0 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = dVar24 * local_e8 +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = dVar24 * dStack_e0 +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = local_e8 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = dStack_e0 * dVar3 +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = auVar20._0_8_ +
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar3;
      auVar20 = vmulsd_avx512f(auVar39,auVar20);
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = auVar20._0_8_ +
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar31;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dVar32;
      local_c8 = auVar14;
      auStack_b8 = auVar13;
      auStack_a8 = auVar12;
      dStack_98 = dVar33;
      dStack_90 = dVar34;
      local_88 = local_338;
      local_78 = auVar19;
      auStack_68 = auVar18;
      auStack_58 = auVar17;
      auStack_48 = auVar16;
    } while (sVar10 != sVar1);
  }
  modules::eigensolver_main
            (&local_1d8,&local_228,(Matrix3d *)local_78,(Matrix3d *)local_c8,&local_168,&local_278,
             output);
  if (indices->_useIndices == true) {
    lVar8 = (long)*(indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  }
  else {
    lVar8 = 0;
  }
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_118,adapter,lVar8);
  if (indices->_useIndices == true) {
    lVar8 = (long)*(indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  }
  else {
    lVar8 = 0;
  }
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_308,adapter,lVar8);
  auVar4._8_8_ = local_308;
  auVar4._0_8_ = local_308;
  auVar17 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (output->rotation).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array,auVar4);
  auVar5._8_8_ = local_300;
  auVar5._0_8_ = local_300;
  auVar17 = vfmadd132pd_avx512vl
                      (*(undefined1 (*) [16])
                        ((output->rotation).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array + 3),auVar17,auVar5);
  auVar22._8_8_ = local_2f8;
  auVar22._0_8_ = local_2f8;
  auVar17 = vfmadd231pd_fma(auVar17,auVar22,
                            *(undefined1 (*) [16])
                             ((output->rotation).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + 6));
  auVar6._8_8_ = dStack_110;
  auVar6._0_8_ = local_118;
  auVar17 = vsubpd_avx(auVar6,auVar17);
  dVar31 = (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar32 = (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  dVar21 = (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  if ((local_108 -
      (local_308 *
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[2] +
      local_300 *
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[5] +
      local_2f8 *
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[8])) * dVar21 + auVar17._0_8_ * dVar31 + auVar17._8_8_ * dVar32 < 0.0) {
    auVar23._0_8_ = -dVar21;
    auVar23._8_8_ = 0x8000000000000000;
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = -dVar31;
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = -dVar32;
    dVar21 = (double)vmovlpd_avx(auVar23);
    (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = dVar21;
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[8];
  dVar21 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[1];
  dVar31 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[2];
  dVar32 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[3];
  dVar33 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[4];
  dVar34 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[5];
  dVar24 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[6];
  dVar26 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[0];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar21;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar31;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar32;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar33;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar34;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar24;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar26;
  return __return_storage_ptr__;
}

Assistant:

rotation_t eigensolver(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    eigensolverOutput_t & output,
    bool useWeights )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 4);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getBearingVector2(indices[i]);
    Eigen::Matrix3d F = f2*f2.transpose();
    
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
  }

  //Do minimization
  modules::eigensolver_main(xxF,yyF,zzF,xyF,yzF,zxF,output);

  //Correct the translation
  bearingVector_t f1 = adapter.getBearingVector1(indices[0]);
  bearingVector_t f2 = adapter.getBearingVector2(indices[0]);
  f2 = output.rotation * f2;
  Eigen::Vector3d opticalFlow = f1 - f2;
  if( opticalFlow.dot(output.translation) < 0.0 )
    output.translation = -output.translation;

  return output.rotation;
}